

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPResCompAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr ownerElem,char *name,xmlChar *refName,xmlChar *refURI,
               xmlSchemaTypeType refType,char *refTypeStr)

{
  xmlChar *strData2;
  xmlChar *str1;
  xmlChar *msg;
  xmlChar *unaff_RBX;
  undefined4 in_register_00000034;
  undefined4 in_stack_00000014;
  xmlChar *des;
  xmlChar *str3;
  
  str1 = (xmlChar *)CONCAT44(in_stack_00000014,refType);
  des = (xmlChar *)0x0;
  str3 = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport
            (&des,(xmlChar *)CONCAT44(in_register_00000034,error),ownerItem,ownerElem);
  if (str1 == (xmlChar *)0x0) {
    str1 = xmlSchemaItemTypeToStr((xmlSchemaTypeType)refURI);
  }
  strData2 = des;
  msg = xmlSchemaFormatQName((xmlChar **)&stack0xffffffffffffffc0,refName,(xmlChar *)name);
  xmlSchemaPErrExt(ctxt,(xmlNodePtr)ownerItem,0xbbc,
                   (xmlChar *)
                   "%s, attribute \'%s\': The QName value \'%s\' does not resolve to a(n) %s.\n",
                   strData2,(xmlChar *)ownerElem,(char *)msg,str1,des,str3,(xmlChar *)ownerElem,
                   unaff_RBX);
  if (des != (xmlChar *)0x0) {
    (*xmlFree)(des);
    des = (xmlChar *)0x0;
  }
  if (str3 != (xmlChar *)0x0) {
    (*xmlFree)(str3);
  }
  return;
}

Assistant:

static void
xmlSchemaPResCompAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerItem,
			 xmlNodePtr ownerElem,
			 const char *name,
			 const xmlChar *refName,
			 const xmlChar *refURI,
			 xmlSchemaTypeType refType,
			 const char *refTypeStr)
{
    xmlChar *des = NULL, *strA = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, ownerItem, ownerElem);
    if (refTypeStr == NULL)
	refTypeStr = (const char *) xmlSchemaItemTypeToStr(refType);
    xmlSchemaPErrExt(ctxt, ownerElem, error,
	    NULL, NULL, NULL,
	    "%s, attribute '%s': The QName value '%s' does not resolve to a(n) "
	    "%s.\n", BAD_CAST des, BAD_CAST name,
	    xmlSchemaFormatQName(&strA, refURI, refName),
	    BAD_CAST refTypeStr, NULL);
    FREE_AND_NULL(des)
    FREE_AND_NULL(strA)
}